

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O0

int idaNlsConvTest(SUNNonlinearSolver NLS,N_Vector ycor,N_Vector del,sunrealtype tol,N_Vector ewt,
                  void *ida_mem)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  sunrealtype rate;
  sunrealtype delnrm;
  int retval;
  int m;
  IDAMem IDA_mem;
  int local_44;
  long local_40;
  double local_28;
  undefined8 local_10;
  int local_4;
  
  if (in_R8 == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x150,"idaNlsConvTest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    local_40 = in_R8;
    local_28 = in_XMM0_Qa;
    local_10 = in_RDI;
    dVar2 = (double)N_VWrmsNorm(in_RDX,in_RCX);
    iVar1 = SUNNonlinSolGetCurIter(local_10,&local_44);
    if (iVar1 == 0) {
      if (local_44 == 0) {
        *(double *)(local_40 + 0x530) = dVar2;
        if (dVar2 <= *(double *)(local_40 + 0x548) * 0.0001) {
          return 0;
        }
      }
      else {
        dVar3 = (double)SUNRpowerR(dVar2 / *(double *)(local_40 + 0x530),1.0 / (double)local_44);
        if (0.9 < dVar3) {
          return 0x386;
        }
        *(double *)(local_40 + 0x528) = dVar3 / (1.0 - dVar3);
      }
      if (local_28 < *(double *)(local_40 + 0x528) * dVar2) {
        local_4 = 0x385;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x14;
    }
  }
  return local_4;
}

Assistant:

static int idaNlsConvTest(SUNNonlinearSolver NLS,
                          SUNDIALS_MAYBE_UNUSED N_Vector ycor, N_Vector del,
                          sunrealtype tol, N_Vector ewt, void* ida_mem)
{
  IDAMem IDA_mem;
  int m, retval;
  sunrealtype delnrm;
  sunrealtype rate;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* compute the norm of the correction */
  delnrm = N_VWrmsNorm(del, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != IDA_SUCCESS) { return (IDA_MEM_NULL); }

  /* test for convergence, first directly, then with rate estimate. */
  if (m == 0)
  {
    IDA_mem->ida_oldnrm = delnrm;
    if (delnrm <= PT0001 * IDA_mem->ida_toldel) { return (SUN_SUCCESS); }
  }
  else
  {
    rate = SUNRpowerR(delnrm / IDA_mem->ida_oldnrm, ONE / m);
    if (rate > RATEMAX) { return (SUN_NLS_CONV_RECVR); }
    IDA_mem->ida_ss = rate / (ONE - rate);
  }

  if (IDA_mem->ida_ss * delnrm <= tol) { return (SUN_SUCCESS); }

  /* not yet converged */
  return (SUN_NLS_CONTINUE);
}